

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O3

void __thiscall MkvInterface::handleInfo(MkvInterface *this)

{
  int *UpperLevel;
  EbmlElement **ppEVar1;
  EbmlStream *pEVar2;
  int iVar3;
  undefined4 extraout_var;
  EbmlElement *pEVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  EbmlElement *local_e8;
  
  pEVar2 = this->aStream;
  iVar3 = (*this->m_element1->_vptr_EbmlElement[4])();
  UpperLevel = &this->m_upperElementa;
  pEVar4 = libebml::EbmlStream::FindNextElement
                     (pEVar2,*(EbmlSemanticContext **)(CONCAT44(extraout_var,iVar3) + 0x18),
                      UpperLevel,0xffffffff,this->m_allowDummy,1);
  this->m_element2a = pEVar4;
  if ((pEVar4 != (EbmlElement *)0x0) && (iVar3 = this->m_upperElementa, iVar3 < 1)) {
    ppEVar1 = &this->m_element2a;
    do {
      if (iVar3 < 0) {
        *UpperLevel = 0;
      }
      if (this->m_verbose == true) {
        handleInfo();
        pEVar4 = local_e8;
      }
      iVar3 = (*pEVar4->_vptr_EbmlElement[3])(pEVar4);
      if ((*(long *)(libmatroska::KaxTimecodeScale::ClassInfos._8_8_ + 8) ==
           *(long *)((int *)CONCAT44(extraout_var_00,iVar3) + 2)) &&
         (*(int *)libmatroska::KaxTimecodeScale::ClassInfos._8_8_ ==
          *(int *)CONCAT44(extraout_var_00,iVar3))) {
        handleInfo();
      }
      else {
        iVar3 = (*(*ppEVar1)->_vptr_EbmlElement[3])(*ppEVar1);
        if ((*(long *)(libmatroska::KaxDuration::ClassInfos._8_8_ + 8) ==
             *(long *)((int *)CONCAT44(extraout_var_01,iVar3) + 2)) &&
           (*(int *)libmatroska::KaxDuration::ClassInfos._8_8_ ==
            *(int *)CONCAT44(extraout_var_01,iVar3))) {
          handleInfo();
        }
        else {
          iVar3 = (*(*ppEVar1)->_vptr_EbmlElement[3])(*ppEVar1);
          if ((*(long *)(libmatroska::KaxDateUTC::ClassInfos._8_8_ + 8) ==
               *(long *)((int *)CONCAT44(extraout_var_02,iVar3) + 2)) &&
             (*(int *)libmatroska::KaxDateUTC::ClassInfos._8_8_ ==
              *(int *)CONCAT44(extraout_var_02,iVar3))) {
            handleInfo();
          }
          else {
            iVar3 = (*(*ppEVar1)->_vptr_EbmlElement[3])();
            if ((*(long *)(libmatroska::KaxSegmentFilename::ClassInfos._8_8_ + 8) ==
                 *(long *)((int *)CONCAT44(extraout_var_03,iVar3) + 2)) &&
               (*(int *)libmatroska::KaxSegmentFilename::ClassInfos._8_8_ ==
                *(int *)CONCAT44(extraout_var_03,iVar3))) {
              handleInfo();
            }
            else {
              iVar3 = (*(*ppEVar1)->_vptr_EbmlElement[3])(*ppEVar1);
              if ((*(long *)(libmatroska::KaxMuxingApp::ClassInfos._8_8_ + 8) ==
                   *(long *)((int *)CONCAT44(extraout_var_04,iVar3) + 2)) &&
                 (*(int *)libmatroska::KaxMuxingApp::ClassInfos._8_8_ ==
                  *(int *)CONCAT44(extraout_var_04,iVar3))) {
                handleInfo();
              }
              else {
                iVar3 = (*(*ppEVar1)->_vptr_EbmlElement[3])(*ppEVar1);
                if ((*(long *)(libmatroska::KaxWritingApp::ClassInfos._8_8_ + 8) ==
                     *(long *)((int *)CONCAT44(extraout_var_05,iVar3) + 2)) &&
                   (*(int *)libmatroska::KaxWritingApp::ClassInfos._8_8_ ==
                    *(int *)CONCAT44(extraout_var_05,iVar3))) {
                  handleInfo();
                }
                else {
                  handleInfo();
                }
              }
            }
          }
        }
      }
      if (*UpperLevel < 1) {
        pEVar4 = *ppEVar1;
        pEVar2 = this->aStream;
        iVar3 = (*pEVar4->_vptr_EbmlElement[4])(pEVar4);
        libebml::EbmlElement::SkipData
                  (pEVar4,pEVar2,*(EbmlSemanticContext **)(CONCAT44(extraout_var_06,iVar3) + 0x18),
                   (EbmlElement *)0x0,false);
        if (*ppEVar1 != (EbmlElement *)0x0) {
          (*(*ppEVar1)->_vptr_EbmlElement[1])();
        }
        pEVar2 = this->aStream;
        iVar3 = (*this->m_element1->_vptr_EbmlElement[4])();
        pEVar4 = libebml::EbmlStream::FindNextElement
                           (pEVar2,*(EbmlSemanticContext **)(CONCAT44(extraout_var_07,iVar3) + 0x18)
                            ,UpperLevel,0xffffffff,this->m_allowDummy,1);
        this->m_element2a = pEVar4;
      }
      else {
        iVar3 = *UpperLevel + -1;
        *UpperLevel = iVar3;
        if (*ppEVar1 != (EbmlElement *)0x0) {
          (*(*ppEVar1)->_vptr_EbmlElement[1])();
          iVar3 = *UpperLevel;
        }
        pEVar4 = this->m_element3a;
        this->m_element2a = pEVar4;
        if (0 < iVar3) break;
      }
      if ((pEVar4 == (EbmlElement *)0x0) || (iVar3 = *UpperLevel, 0 < iVar3)) break;
    } while( true );
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void MkvInterface::handleInfo()
{
    m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
    
    while (m_element2a != NULL) 
    {
        if (m_upperElementa > 0)
            break;
        if (m_upperElementa < 0)
            m_upperElementa = 0;
    
        //fprintf(stderr, "\tFILE POS = %d, ELEMENT POS = %d\n", m_file->getFilePointer(), m_element2a->GetElementPosition());
        
        if (m_verbose)
        {
            fprintf(stderr, "\tEBML ID: ");
            for (unsigned int i=0; i<EbmlId(*m_element2a).Length; i++)
                fprintf(stderr, "[%02X]", (EbmlId(*m_element2a).Value >> (8*(1-i))) & 0xFF);
            fprintf(stderr, "\n");
        }
        
        if (EbmlId(*m_element2a) == KaxTimecodeScale::ClassInfos.GlobalId)
        {
            KaxTimecodeScale *TimeScale = static_cast<KaxTimecodeScale*>(m_element2a);
            TimeScale->ReadData(aStream->I_O());
            fprintf(stderr, "\tTimecode Scale : %d\n", uint32(*TimeScale));
        }
        else if (EbmlId(*m_element2a) == KaxDuration::ClassInfos.GlobalId)
        {
            KaxDuration *Duration = static_cast<KaxDuration*>(m_element2a);
            Duration->ReadData(aStream->I_O());
            m_duration = Duration->GetValue();
            fprintf(stderr, "\tSegment duration : %0.2fs\n", 1000*m_duration/TIMECODE_SCALE);
        }
        else if (EbmlId(*m_element2a) == KaxDateUTC::ClassInfos.GlobalId)
        {
            fprintf(stderr, "\tDate UTC\n");
        }
        else if (EbmlId(*m_element2a) == KaxSegmentFilename::ClassInfos.GlobalId)
        {
            KaxSegmentFilename *fn = static_cast<KaxSegmentFilename*>(m_element2a);
            fn->ReadData(aStream->I_O());
            fprintf(stderr, "\tSegment filename : %s\n", UTFstring(*fn).GetUTF8().c_str());
        }
        else if (EbmlId(*m_element2a) == KaxMuxingApp::ClassInfos.GlobalId)
        {
            KaxMuxingApp *pApp = static_cast<KaxMuxingApp*>(m_element2a);
            pApp->ReadData(aStream->I_O());
            fprintf(stderr, "\tMuxing app : %s\n", UTFstring(*pApp).GetUTF8().c_str());
        }
        else if (EbmlId(*m_element2a) == KaxWritingApp::ClassInfos.GlobalId)
        {
            KaxWritingApp *pApp = static_cast<KaxWritingApp*>(m_element2a);
            pApp->ReadData(aStream->I_O());
            fprintf(stderr, "\tWriting app : %s\n", UTFstring(*pApp).GetUTF8().c_str());
        }
        else
        {
            fprintf(stderr, "\tOther...\n");
        }
        
        if (m_upperElementa > 0)
        {
            m_upperElementa--;
            delete m_element2a;
            m_element2a = m_element3a;
            if (m_upperElementa > 0)
                break;
        } 
        else
        {
            m_element2a->SkipData(*aStream, m_element2a->Generic().Context);
            delete m_element2a;

            m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
        }
    }
    fprintf(stderr, "\n");
}